

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O0

void __thiscall sf2cute::SFZone::SetGenerator(SFZone *this,SFGeneratorItem generator)

{
  bool bVar1;
  SFGenerator op;
  reference this_00;
  type pSVar2;
  unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>
  *old_generator;
  unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_> local_30;
  __normal_iterator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_*,_std::vector<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>_>
  local_28;
  __normal_iterator<const_std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_*,_std::vector<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>_>
  local_20;
  const_iterator it;
  SFZone *this_local;
  SFGeneratorItem generator_local;
  
  it._M_current =
       (unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_> *)this;
  this_local._4_4_ = generator;
  op = SFGeneratorItem::op((SFGeneratorItem *)((long)&this_local + 4));
  local_20._M_current =
       (unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_> *)
       FindGenerator(this,op);
  local_28._M_current =
       (unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_> *)
       std::
       vector<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
       ::end(&this->generators_);
  bVar1 = __gnu_cxx::operator==(&local_20,&local_28);
  if (bVar1) {
    std::make_unique<sf2cute::SFGeneratorItem,sf2cute::SFGeneratorItem>
              ((SFGeneratorItem *)&local_30);
    std::
    vector<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
    ::push_back(&this->generators_,(value_type *)&local_30);
    std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>::
    ~unique_ptr(&local_30);
  }
  else {
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_*,_std::vector<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>_>
              ::operator*(&local_20);
    pSVar2 = std::
             unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>::
             operator*(this_00);
    *pSVar2 = this_local._4_4_;
  }
  return;
}

Assistant:

void SFZone::SetGenerator(SFGeneratorItem generator) {
  // Find the generator.
  const auto it = FindGenerator(generator.op());
  if (it == generators_.end()) {
    generators_.push_back(std::make_unique<SFGeneratorItem>(std::move(generator)));
  }
  else {
    const std::unique_ptr<SFGeneratorItem> & old_generator = *it;
    *old_generator = std::move(generator);
  }
}